

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::clearContents(QLabelPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  
  if (this->control != (QWidgetTextControl *)0x0) {
    (**(code **)(*(long *)this->control + 0x20))();
  }
  this->control = (QWidgetTextControl *)0x0;
  this->field_0x340 = this->field_0x340 & 0xcf;
  std::_Optional_payload_base<QPicture>::_M_reset
            ((_Optional_payload_base<QPicture> *)&this->picture);
  std::_Optional_payload_base<QIcon>::_M_reset((_Optional_payload_base<QIcon> *)&this->icon);
  (this->pixmapSize).wd = -1;
  (this->pixmapSize).ht = -1;
  QString::clear(&this->text);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  if (this->shortcutId != 0) {
    QWidget::releaseShortcut(this_00,this->shortcutId);
  }
  this->shortcutId = 0;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 8) {
    QObject::disconnect((Connection *)((long)&(this->movieConnections)._M_elems[0].d_ptr + lVar1));
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->movie).wp,(QObject *)0x0);
  if ((char)*(ushort *)&this->field_0x340 < '\0') {
    if ((*(ushort *)&this->field_0x340 & 0x40) == 0) {
      QWidget::unsetCursor(this_00);
    }
    else {
      QWidget::setCursor(this_00,&this->cursor);
    }
  }
  this->field_0x340 = this->field_0x340 & 0x3f;
  return;
}

Assistant:

void QLabelPrivate::clearContents()
{
    delete control;
    control = nullptr;
    isTextLabel = false;
    hasShortcut = false;

#ifndef QT_NO_PICTURE
    picture.reset();
#endif
    icon.reset();
    pixmapSize = QSize();

    text.clear();
    Q_Q(QLabel);
#ifndef QT_NO_SHORTCUT
    if (shortcutId)
        q->releaseShortcut(shortcutId);
    shortcutId = 0;
#endif
#if QT_CONFIG(movie)
    for (const auto &conn : std::as_const(movieConnections))
        QObject::disconnect(conn);
    movie = nullptr;
#endif
#ifndef QT_NO_CURSOR
    if (onAnchor) {
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
    }
    validCursor = false;
    onAnchor = false;
#endif
}